

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

uint32_t __thiscall
cfd::ConfidentialTransactionContext::GetVsizeIgnoreTxIn
          (ConfidentialTransactionContext *this,bool is_blinded,int exponent,int minimum_bits,
          uint32_t asset_count)

{
  uint32_t uVar1;
  uint32_t no_witness_size;
  uint32_t witness_size;
  uint32_t local_18;
  uint32_t local_14;
  
  local_14 = 0;
  local_18 = 0;
  GetSizeIgnoreTxIn(this,is_blinded,&local_14,&local_18,exponent,minimum_bits,asset_count);
  uVar1 = core::AbstractTransaction::GetVsizeFromSize(local_18,local_14);
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransactionContext::GetVsizeIgnoreTxIn(
    bool is_blinded, int exponent, int minimum_bits,
    uint32_t asset_count) const {
  uint32_t witness_size = 0;
  uint32_t no_witness_size = 0;
  GetSizeIgnoreTxIn(
      is_blinded, &witness_size, &no_witness_size, exponent, minimum_bits,
      asset_count);
  return AbstractTransaction::GetVsizeFromSize(no_witness_size, witness_size);
}